

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_add_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi *pmVar1;
  int iVar2;
  mbedtls_mpi *T;
  mbedtls_mpi_uint c;
  mbedtls_mpi_uint *p;
  mbedtls_mpi_uint *o;
  size_t j;
  size_t i;
  mbedtls_mpi *pmStack_20;
  int ret;
  mbedtls_mpi *B_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  
  pmStack_20 = B;
  B_local = A;
  if (X == B) {
    pmStack_20 = A;
    B_local = X;
  }
  if ((X == B_local) || (i._4_4_ = mbedtls_mpi_copy(X,B_local), i._4_4_ == 0)) {
    X->s = 1;
    for (o = (mbedtls_mpi_uint *)pmStack_20->n;
        (o != (mbedtls_mpi_uint *)0x0 && (pmStack_20->p[(long)o + -1] == 0));
        o = (mbedtls_mpi_uint *)((long)o + -1)) {
    }
    i._4_4_ = mbedtls_mpi_grow(X,(size_t)o);
    if (i._4_4_ == 0) {
      p = pmStack_20->p;
      c = (mbedtls_mpi_uint)X->p;
      T = (mbedtls_mpi *)0x0;
      for (j = 0; j < o; j = j + 1) {
        *(long *)c = (long)&T->s + *(long *)c;
        pmVar1 = *(mbedtls_mpi **)c;
        *(mbedtls_mpi_uint *)c = *p + *(long *)c;
        T = (mbedtls_mpi *)((long)(int)(uint)(*(ulong *)c < *p) + (long)(int)(uint)(pmVar1 < T));
        p = p + 1;
        c = c + 8;
      }
      for (; T != (mbedtls_mpi *)0x0; T = (mbedtls_mpi *)(long)(int)(uint)(pmVar1 < T)) {
        if (X->n <= j) {
          iVar2 = mbedtls_mpi_grow(X,j + 1);
          if (iVar2 != 0) {
            return iVar2;
          }
          c = (mbedtls_mpi_uint)(X->p + j);
          i._4_4_ = 0;
        }
        *(long *)c = (long)&T->s + *(long *)c;
        pmVar1 = *(mbedtls_mpi **)c;
        j = j + 1;
        c = c + 8;
      }
    }
  }
  return i._4_4_;
}

Assistant:

int mbedtls_mpi_add_abs( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret;
    size_t i, j;
    mbedtls_mpi_uint *o, *p, c;

    if( X == B )
    {
        const mbedtls_mpi *T = A; A = X; B = T;
    }

    if( X != A )
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, A ) );

    /*
     * X should always be positive as a result of unsigned additions.
     */
    X->s = 1;

    for( j = B->n; j > 0; j-- )
        if( B->p[j - 1] != 0 )
            break;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, j ) );

    o = B->p; p = X->p; c = 0;

    for( i = 0; i < j; i++, o++, p++ )
    {
        *p +=  c; c  = ( *p <  c );
        *p += *o; c += ( *p < *o );
    }

    while( c != 0 )
    {
        if( i >= X->n )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i + 1 ) );
            p = X->p + i;
        }

        *p += c; c = ( *p < c ); i++; p++;
    }

cleanup:

    return( ret );
}